

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsLpRelaxation.h
# Opt level: O3

Status __thiscall HighsLpRelaxation::Playground::solveLp(Playground *this,HighsDomain *localdom)

{
  Status SVar1;
  
  if (this->iterateStored == true) {
    flushDomain(this->lp,localdom,false);
    Highs::getIterate(&this->lp->lpsolver);
  }
  else {
    Highs::putIterate(&this->lp->lpsolver);
    flushDomain(this->lp,localdom,false);
    this->iterateStored = true;
  }
  SVar1 = run(this->lp,false);
  return SVar1;
}

Assistant:

HighsLpRelaxation::Status solveLp(HighsDomain& localdom) {
      if (iterateStored) {
        lp->flushDomain(localdom);
        lp->getLpSolver().getIterate();
      } else {
        assert(lp->getLpSolver().getInfo().valid);
        lp->getLpSolver().putIterate();
        lp->flushDomain(localdom);
        iterateStored = true;
      }

      return lp->run(false);
    }